

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::BlitRectCase::BlitRectCase
          (BlitRectCase *this,Context *context,char *name,char *desc,deUint32 filter,IVec2 *srcSize,
          IVec4 *srcRect,IVec2 *dstSize,IVec4 *dstRect,int cellSize)

{
  int i_1;
  int i;
  long lVar1;
  
  lVar1 = 0;
  FboTestCase::FboTestCase(&this->super_FboTestCase,context,name,desc,false);
  (this->super_FboTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FboTestCase_00d11a08;
  this->m_filter = filter;
  (this->m_srcSize).m_data[0] = srcSize->m_data[0];
  (this->m_srcSize).m_data[1] = srcSize->m_data[1];
  do {
    (this->m_srcRect).m_data[lVar1] = srcRect->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  (this->m_dstSize).m_data[0] = dstSize->m_data[0];
  (this->m_dstSize).m_data[1] = dstSize->m_data[1];
  lVar1 = 0;
  do {
    (this->m_dstRect).m_data[lVar1] = dstRect->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  this->m_cellSize = cellSize;
  (this->m_gridCellColorA).m_data[0] = 0.2;
  (this->m_gridCellColorA).m_data[1] = 0.7;
  (this->m_gridCellColorA).m_data[2] = 0.1;
  (this->m_gridCellColorA).m_data[3] = 1.0;
  (this->m_gridCellColorB).m_data[0] = 0.7;
  (this->m_gridCellColorB).m_data[1] = 0.1;
  (this->m_gridCellColorB).m_data[2] = 0.5;
  (this->m_gridCellColorB).m_data[3] = 0.8;
  return;
}

Assistant:

BlitRectCase (Context& context, const char* name, const char* desc, deUint32 filter, const IVec2& srcSize, const IVec4& srcRect, const IVec2& dstSize, const IVec4& dstRect, int cellSize = 8)
		: FboTestCase		(context, name, desc)
		, m_filter			(filter)
		, m_srcSize			(srcSize)
		, m_srcRect			(srcRect)
		, m_dstSize			(dstSize)
		, m_dstRect			(dstRect)
		, m_cellSize		(cellSize)
		, m_gridCellColorA	(0.2f, 0.7f, 0.1f, 1.0f)
		, m_gridCellColorB	(0.7f, 0.1f, 0.5f, 0.8f)
	{
	}